

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  FieldType FVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"third_party/protobuf-lite/extension_set.cc",0xfd);
    pLVar3 = LogMessage::operator<<
                       (&local_48,"Don\'t lookup extension types if they aren\'t present (1). ");
    LogFinisher::operator=(&local_49,pLVar3);
    LogMessage::~LogMessage(&local_48);
    FVar1 = '\0';
  }
  else {
    if ((pEVar2->field_0xa & 1) != 0) {
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,"third_party/protobuf-lite/extension_set.cc",0x101);
      pLVar3 = LogMessage::operator<<
                         (&local_48,"Don\'t lookup extension types if they aren\'t present (2). ");
      LogFinisher::operator=(&local_49,pLVar3);
      LogMessage::~LogMessage(&local_48);
    }
    FVar1 = pEVar2->type;
  }
  return FVar1;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == NULL) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}